

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfBoxAttribute.cpp
# Opt level: O1

void __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<int>_>_>::readValueFrom
          (TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<int>_>_> *this,IStream *is,int size,
          int version)

{
  char b [4];
  int local_1c;
  
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  (this->_value).min.x = local_1c;
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  (this->_value).min.y = local_1c;
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  (this->_value).max.x = local_1c;
  (*is->_vptr_IStream[3])(is,&local_1c,4);
  (this->_value).max.y = local_1c;
  return;
}

Assistant:

void
Box2iAttribute::readValueFrom (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is, int size, int version)
{
    Xdr::read <StreamIO> (is, _value.min.x);
    Xdr::read <StreamIO> (is, _value.min.y);
    Xdr::read <StreamIO> (is, _value.max.x);
    Xdr::read <StreamIO> (is, _value.max.y);
}